

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

void get_shortest_string(gpointer user,gpointer user_data)

{
  size_t sVar1;
  size_t display_string_length;
  string_plus_length *spl;
  filename_list_node *fln;
  gpointer user_data_local;
  gpointer user_local;
  
  sVar1 = strlen(*(char **)(*user + 8));
  if (sVar1 < *(ulong *)((long)user_data + 8)) {
    *(undefined8 *)user_data = *(undefined8 *)(*user + 8);
    *(size_t *)((long)user_data + 8) = sVar1;
  }
  return;
}

Assistant:

static void get_shortest_string(gpointer user, gpointer user_data)
{
    struct filename_list_node *fln = (struct filename_list_node *) user;
    struct string_plus_length *spl = (struct string_plus_length *) user_data;
    size_t display_string_length = strlen(fln->fr->display);

    if (display_string_length < spl->length) {
        spl->string = fln->fr->display;
        spl->length = display_string_length;
    }
}